

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::new_line
          (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this)

{
  long lVar1;
  stream_sink<char> *this_00;
  char *s;
  long in_RDI;
  int i;
  basic_json_encode_options<char> *in_stack_ffffffffffffff78;
  stream_sink<char> *this_01;
  int local_58;
  string local_48 [32];
  
  lVar1 = in_RDI + 8;
  s = (char *)(in_RDI + 0x40);
  this_01 = (stream_sink<char> *)&stack0xffffffffffffffd8;
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_(in_stack_ffffffffffffff78);
  this_00 = (stream_sink<char> *)std::__cxx11::string::data();
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_(in_stack_ffffffffffffff78);
  std::__cxx11::string::length();
  stream_sink<char>::append(this_00,s,(size_t)this_01);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x1a0); local_58 = local_58 + 1) {
    stream_sink<char>::push_back(this_01,(char)((ulong)lVar1 >> 0x38));
  }
  *(long *)(in_RDI + 0x1a8) = (long)*(int *)(in_RDI + 0x1a0);
  return;
}

Assistant:

void new_line()
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (int i = 0; i < indent_amount_; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = indent_amount_;
        }